

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetAllDomains(Registry *this,DomainArray *aRet)

{
  PersistentStorage *pPVar1;
  Status SVar2;
  int iVar3;
  Domain local_40;
  
  pPVar1 = this->mStorage;
  Domain::Domain(&local_40);
  iVar3 = (*pPVar1->_vptr_PersistentStorage[0x15])(pPVar1,&local_40,aRet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.mName._M_dataplus._M_p != &local_40.mName.field_2) {
    operator_delete(local_40.mName._M_dataplus._M_p);
  }
  SVar2 = kNotFound;
  if ((char)iVar3 != '\x01') {
    SVar2 = ((char)iVar3 != '\0') << 2;
  }
  return SVar2;
}

Assistant:

Registry::Status Registry::GetAllDomains(DomainArray &aRet)
{
    Registry::Status status;

    status = MapStatus(mStorage->Lookup(Domain{}, aRet));

    return status;
}